

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::RpcDumper::addSchema(RpcDumper *this,InterfaceSchema schema)

{
  mapped_type *pmVar1;
  Reader local_50;
  uint64_t local_20;
  RpcDumper *local_18;
  RpcDumper *this_local;
  InterfaceSchema schema_local;
  
  local_18 = this;
  this_local = (RpcDumper *)schema.super_Schema.raw;
  Schema::getProto(&local_50,(Schema *)&this_local);
  local_20 = capnp::schema::Node::Reader::getId(&local_50);
  pmVar1 = std::
           map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
           ::operator[](&this->schemas,&local_20);
  (pmVar1->super_Schema).raw = (RawBrandedSchema *)this_local;
  return;
}

Assistant:

void addSchema(InterfaceSchema schema) {
    schemas[schema.getProto().getId()] = schema;
  }